

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCascade.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkBddDec(Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  int *piVar2;
  DdManager *dd;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  undefined8 uVar5;
  reo_man *p;
  DdNode *n;
  Abc_Ntk_t *pAVar6;
  DdNode **pbVars;
  int iVar7;
  long lVar8;
  char *format;
  reo_man *pReo;
  long lVar9;
  int iVar10;
  DdNode *pFuncs [256];
  DdNode *local_838 [257];
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                  ,0x3f3,"Abc_Ntk_t *Abc_NtkBddDec(Abc_Ntk_t *, int)");
  }
  if (0x100 < pNtk->vCos->nSize) {
    __assert_fail("Abc_NtkCoNum(pNtk) <= BDD_FUNC_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                  ,0x3f4,"Abc_Ntk_t *Abc_NtkBddDec(Abc_Ntk_t *, int)");
  }
  format = (char *)0xf4240;
  pAVar6 = pNtk;
  dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,1000000,0,1,fVerbose);
  if (dd == (DdManager *)0x0) {
    Abc_Print((int)pAVar6,format);
    pAVar6 = (Abc_Ntk_t *)0x0;
  }
  else {
    pVVar3 = pNtk->vCos;
    if (0 < pVVar3->nSize) {
      lVar9 = 0;
      do {
        lVar8 = *(long *)(*pVVar3->pArray[lVar9] + 0x1b0);
        if (*(int *)(lVar8 + 4) < 8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        piVar2 = *(int **)(*(long *)(lVar8 + 8) + 0x38);
        if (*(void **)(piVar2 + 2) == (void *)0x0) {
          __assert_fail("p->pArrayPtr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecAtt.h"
                        ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
        }
        iVar7 = (int)*(long *)((long)pVVar3->pArray[lVar9] + 0x10);
        lVar8 = (long)iVar7;
        iVar1 = *piVar2;
        if (iVar1 <= iVar7) {
          iVar10 = iVar7 + 10;
          if (iVar7 < iVar1 * 2) {
            iVar10 = iVar1 * 2;
          }
          if (iVar1 < iVar10) {
            pvVar4 = realloc(*(void **)(piVar2 + 2),(long)iVar10 * 8);
            *(void **)(piVar2 + 2) = pvVar4;
            memset((void *)((long)pvVar4 + (long)*piVar2 * 8),0,((long)iVar10 - (long)*piVar2) * 8);
            *piVar2 = iVar10;
          }
        }
        if ((*(long *)(*(long *)(piVar2 + 2) + lVar8 * 8) == 0) &&
           (*(code **)(piVar2 + 8) != (code *)0x0)) {
          uVar5 = (**(code **)(piVar2 + 8))(*(undefined8 *)(piVar2 + 4));
          *(undefined8 *)(*(long *)(piVar2 + 2) + lVar8 * 8) = uVar5;
        }
        local_838[lVar9] = *(DdNode **)(*(long *)(piVar2 + 2) + lVar8 * 8);
        lVar9 = lVar9 + 1;
        pVVar3 = pNtk->vCos;
      } while (lVar9 < pVVar3->nSize);
    }
    pVVar3 = pNtk->vCis;
    if (dd->size != pVVar3->nSize) {
      __assert_fail("dd->size == Abc_NtkCiNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                    ,0x400,"Abc_Ntk_t *Abc_NtkBddDec(Abc_Ntk_t *, int)");
    }
    if (0 < pNtk->vCos->nSize) {
      iVar7 = 0;
      do {
        Cudd_addNewVarAtLevel(dd,dd->size);
        iVar7 = iVar7 + 1;
      } while (iVar7 < pNtk->vCos->nSize);
    }
    iVar7 = (int)pVVar3;
    p = Extra_ReorderInit(pNtk->vCis->nSize,1000);
    Extra_ReorderSetMinimizationType(p,REO_MINIMIZE_WIDTH);
    Extra_ReorderSetVerification(p,1);
    pReo = p;
    Extra_ReorderSetVerbosity(p,1);
    n = Abc_NtkBddDecInt(pReo,dd,local_838,iVar7,pNtk->vCos->nSize);
    Cudd_Ref(n);
    Extra_ReorderQuit(p);
    Abc_NtkExploreCofs(dd,n,pbVars,pNtk->vCis->nSize,6);
    pAVar6 = Abc_NtkDup(pNtk);
    Cudd_RecursiveDeref(dd,n);
    Abc_NtkFreeGlobalBdds(pNtk,1);
  }
  return pAVar6;
}

Assistant:

Abc_Ntk_t * Abc_NtkBddDec( Abc_Ntk_t * pNtk, int fVerbose )
{
    int nBddSizeMax   = 1000000;
    int fDropInternal =       0;
    int fReorder      =       1;
    Abc_Ntk_t * pNtkNew;
    reo_man * pReo;
    DdManager * dd;
    DdNode * pFuncs[BDD_FUNC_MAX];
    DdNode * bFunc;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkCoNum(pNtk) <= BDD_FUNC_MAX );
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, nBddSizeMax, fDropInternal, fReorder, fVerbose );
    if ( dd == NULL )
    {
        Abc_Print( -1, "Construction of global BDDs has failed.\n" );
        return NULL;
    }
    // collect global BDDs
    Abc_NtkForEachCo( pNtk, pNode, i )
        pFuncs[i] = (DdNode *)Abc_ObjGlobalBdd(pNode);

    // create new variables at the bottom
    assert( dd->size == Abc_NtkCiNum(pNtk) );
    for ( i = 0; i < Abc_NtkCoNum(pNtk); i++ )
        Cudd_addNewVarAtLevel( dd, dd->size );

    // prepare reordering engine
    pReo = Extra_ReorderInit( Abc_NtkCiNum(pNtk), 1000 );
    Extra_ReorderSetMinimizationType( pReo, REO_MINIMIZE_WIDTH );
    Extra_ReorderSetVerification( pReo, 1 );
    Extra_ReorderSetVerbosity( pReo, 1 );

    // derive characteristic function
    bFunc = Abc_NtkBddDecInt( pReo, dd, pFuncs, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk) );  Cudd_Ref( bFunc );
    Extra_ReorderQuit( pReo );

Abc_NtkExploreCofs( dd, bFunc, dd->vars, Abc_NtkCiNum(pNtk), 6 );

    // create new network
//    pNtkNew = Abc_NtkCreateFromCharFunc( pNtk, dd, bFunc );
    pNtkNew = Abc_NtkDup( pNtk );

    // cleanup
    Cudd_RecursiveDeref( dd, bFunc );
    Abc_NtkFreeGlobalBdds( pNtk, 1 );
    return pNtkNew;
}